

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

ReceiverStatistics __thiscall
tonk::ReceiverBandwidthControl::GetStatistics(ReceiverBandwidthControl *this)

{
  ReceiverStatistics RVar1;
  
  RVar1.LossRate = (this->Bandwidth).Measurement.SmoothedPLR;
  RVar1.GoodputBPS = (this->Bandwidth).Measurement.SmoothedGoodputBPS;
  RVar1.TripUsec = (this->Bandwidth).Measurement.SmoothedMinTripUsec;
  return RVar1;
}

Assistant:

ReceiverStatistics ReceiverBandwidthControl::GetStatistics() const
{
    ReceiverStatistics stats;
    stats.GoodputBPS = Bandwidth.Measurement.SmoothedGoodputBPS;

    // This must be the minimum so that the bandwidth controller on the other side uses a
    // minimum OWD to base RTT estimate on when planning to flush the bottleneck router queue.
    // If we over-estimate the RTT, then we may not fully flush before the next probe.
    // If we under-estimate the RTT, then we will not cause any issues.
    stats.TripUsec = Bandwidth.Measurement.SmoothedMinTripUsec;

    stats.LossRate = Bandwidth.Measurement.SmoothedPLR;
    return stats;
}